

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall
crypto_tests::CryptoTest::TestChaCha20Poly1305
          (CryptoTest *this,string *plain_hex,string *aad_hex,string *key_hex,Nonce96 nonce,
          string *cipher_hex)

{
  long lVar1;
  Span<const_std::byte> aad_00;
  Nonce96 nonce_00;
  Nonce96 nonce_01;
  Span<std::byte> plain1;
  Span<std::byte> cipher_00;
  Span<std::byte> plain2;
  readonly_property<bool> rVar2;
  uint uVar3;
  element_type *peVar4;
  pointer pbVar5;
  byte *pbVar6;
  size_t sVar7;
  uint uVar8;
  byte *pbVar9;
  element_type *peVar10;
  iterator pvVar11;
  element_type *peVar12;
  int iVar13;
  element_type *peVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  bool bVar16;
  undefined4 uVar17;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  Span<const_std::byte> key_00;
  Span<const_std::byte> plain1_00;
  const_string file;
  Span<const_std::byte> cipher_01;
  const_string file_00;
  const_string file_01;
  Span<const_std::byte> key_01;
  Nonce96 nonce_02;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  Span<const_std::byte> plain2_00;
  Span<const_std::byte> aad_01;
  Span<std::byte> keystream_00;
  vector<std::byte,_std::allocator<std::byte>_> decipher;
  vector<std::byte,_std::allocator<std::byte>_> keystream;
  vector<std::byte,_std::allocator<std::byte>_> expected_cipher;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<std::byte,_std::allocator<std::byte>_> aad;
  vector<std::byte,_std::allocator<std::byte>_> plain;
  vector<std::byte,_std::allocator<std::byte>_> cipher;
  AEADChaCha20Poly1305 aead;
  check_type cVar18;
  undefined4 uVar19;
  element_type *peVar20;
  element_type *peVar21;
  byte local_2d1;
  assertion_result local_2d0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  vector<std::byte,_std::allocator<std::byte>_> local_290;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  byte *local_218;
  size_t sStack_210;
  element_type *local_208;
  element_type *peStack_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined8 uStack_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  element_type *local_1b8;
  element_type *peStack_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  element_type *peStack_1a0;
  undefined **local_198;
  pointer pbStack_190;
  vector<std::byte,_std::allocator<std::byte>_> local_188;
  vector<std::byte,_std::allocator<std::byte>_> local_170;
  vector<std::byte,_std::allocator<std::byte>_> local_158;
  vector<std::byte,_std::allocator<std::byte>_> local_140;
  pointer local_128;
  vector<std::byte,_std::allocator<std::byte>_> local_120;
  pointer *local_108;
  undefined1 local_100 [16];
  pointer pbStack_f0;
  undefined1 *local_e8;
  vector<std::byte,_std::allocator<std::byte>_> *local_e0;
  char *local_d8;
  char *local_d0;
  assertion_result local_c8;
  ChaCha20 local_ac;
  long local_38;
  
  peVar10 = (element_type *)nonce.second;
  uVar8 = nonce.first;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (plain_hex->_M_dataplus)._M_p;
  hex_str._M_len = plain_hex->_M_string_length;
  peVar12 = peVar10;
  ParseHex<std::byte>(&local_140,hex_str);
  hex_str_00._M_str = (aad_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = aad_hex->_M_string_length;
  ParseHex<std::byte>(&local_158,hex_str_00);
  hex_str_01._M_str = (key_hex->_M_dataplus)._M_p;
  hex_str_01._M_len = key_hex->_M_string_length;
  ParseHex<std::byte>(&local_170,hex_str_01);
  hex_str_02._M_str = (cipher_hex->_M_dataplus)._M_p;
  hex_str_02._M_len = cipher_hex->_M_string_length;
  ParseHex<std::byte>(&local_188,hex_str_02);
  iVar13 = 0;
  do {
    if (iVar13 == 0) {
      peVar4 = (element_type *)
               (local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish +
               -(long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    else {
      peVar14 = (element_type *)
                (local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start);
      if (peVar14 == (element_type *)0x0) {
        uVar3 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if (peVar14 != (element_type *)0x0) {
          for (; (ulong)peVar14 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar3 = (uint)lVar1 ^ 0x3f;
      }
      do {
        peVar4 = (element_type *)
                 RandomMixin<FastRandomContext>::randbits
                           (&(this->super_BasicTestingSetup).m_rng.
                             super_RandomMixin<FastRandomContext>,0x40 - uVar3);
      } while (peVar14 < peVar4);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&local_120,
               (size_type)
               (local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_start)),(allocator_type *)&local_ac)
    ;
    key_00.m_size =
         (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    key_00.m_data =
         local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    AEADChaCha20Poly1305::AEADChaCha20Poly1305((AEADChaCha20Poly1305 *)&local_ac,key_00);
    if (iVar13 == 0) {
      peVar14 = (element_type *)
                (local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pbStack_f0 = local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish +
                   -(long)local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      peVar12 = (element_type *)
                (CONCAT71(local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish._1_7_,
                          local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_finish._0_1_) -
                (long)local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start);
      local_2d0._0_8_ =
           local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c8._0_4_ = uVar8;
      local_100._8_8_ =
           local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      pbVar6 = (byte *)0x0;
      pbVar9 = (byte *)0x0;
      peVar20 = (element_type *)local_c8._0_8_;
      peVar21 = peVar12;
      local_2d0.m_message.px = peVar12;
      local_c8.m_message.px = peVar10;
      aad_01.m_size = pbStack_f0;
    }
    else {
      pbVar6 = local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start + (long)peVar4;
      pbVar9 = local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish + -(long)pbVar6;
      local_198 = (undefined **)
                  local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pbStack_190 = local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                    -(long)local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      local_1b8 = (element_type *)
                  local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      peStack_1b0 = (element_type *)
                    (CONCAT71(local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_finish._1_7_,
                              local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_finish._0_1_) -
                    (long)local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
      peVar14 = peVar4;
      peVar20 = (element_type *)CONCAT44(uStack_1a4,uVar8);
      peVar21 = peStack_1b0;
      local_1a8 = uVar8;
      peStack_1a0 = peVar10;
      aad_01.m_size = pbStack_190;
    }
    aad_00.m_size._0_4_ = (check_type)aad_01.m_size;
    aad_00.m_data =
         local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_00.m_size._4_4_ = (int)((ulong)aad_01.m_size >> 0x20);
    nonce_01.second = (unsigned_long)peVar10;
    nonce_01._0_8_ = peVar20;
    cipher_00.m_size = (size_t)peVar21;
    cipher_00.m_data =
         local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain1_00.m_size = (size_t)peVar14;
    plain1_00.m_data =
         local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain2_00.m_size = (size_t)pbVar9;
    plain2_00.m_data = pbVar6;
    AEADChaCha20Poly1305::Encrypt
              ((AEADChaCha20Poly1305 *)&local_ac,plain1_00,plain2_00,aad_00,nonce_01,cipher_00);
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x110;
    file.m_begin = (iterator)&local_1c8;
    msg.m_end = (iterator)peVar12;
    msg.m_begin = (iterator)pbVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d8,msg);
    peVar12 = (element_type *)
              CONCAT71(local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish._1_7_,
                       local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish._0_1_);
    if ((long)peVar12 -
        (long)local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
      bVar16 = (element_type *)
               local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start == peVar12;
      if (!bVar16) {
        peVar14 = (element_type *)
                  local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pbVar5 = local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(byte *)&(((wrapped_stream *)
                       local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start)->
                      super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream ==
            *local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start) {
          do {
            pbVar5 = pbVar5 + 1;
            peVar14 = (element_type *)
                      ((long)&(peVar14->m_stream).super_basic_ostream<char,_std::char_traits<char>_>
                              ._vptr_basic_ostream + 1);
            bVar16 = peVar14 == peVar12;
            if (bVar16) goto LAB_003674a3;
          } while (*(byte *)&(peVar14->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream == *pbVar5);
        }
        bVar16 = false;
      }
    }
    else {
      bVar16 = false;
    }
LAB_003674a3:
    local_2d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar16;
    local_2d0.m_message.px = (element_type *)0x0;
    local_2d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c8._0_8_ = "cipher == expected_cipher";
    local_c8.m_message.px = (element_type *)0xeaa32c;
    pbStack_f0 = (pointer)((ulong)pbStack_f0 & 0xffffffffffffff00);
    local_100._8_8_ = &PTR__lazy_ostream_013d3df0;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = (vector<std::byte,_std::allocator<std::byte>_> *)&local_c8;
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1e0 = "";
    keystream_00.m_size = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_2d0,(lazy_ostream *)(local_100 + 8),1,0,WARN,(check_type)aad_01.m_size,
               (size_t)&local_1e8,0x110);
    boost::detail::shared_count::~shared_count(&local_2d0.m_message.pn);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)&local_2d0,
               (CONCAT71(local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish._1_7_,
                         local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                         .super__Vector_impl_data._M_finish._0_1_) -
               (long)local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start) - 0x10,(allocator_type *)(local_100 + 8));
    peVar12 = uStack_1f0;
    cipher_01.m_size =
         CONCAT71(local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish._1_7_,
                  local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_) -
         (long)local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    uStack_1f0._0_4_ = (check_type)nonce.second;
    cVar18 = (check_type)uStack_1f0;
    uStack_1f0._4_4_ = nonce.second._4_4_;
    uVar19 = uStack_1f0._4_4_;
    if (iVar13 == 0) {
      peVar4 = (element_type *)((long)local_2d0.m_message.px - local_2d0._0_8_);
      local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           local_2d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
           value;
      local_c8._1_7_ = local_2d0._1_7_;
      local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,uVar8);
      local_100._8_8_ = (undefined **)0x0;
      pbStack_f0 = (pointer)0x0;
      pbVar6 = (byte *)0x0;
      sVar7 = 0;
      uVar17 = local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start._4_4_;
      local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)peVar10;
      uStack_1f0 = peVar12;
      local_c8.m_message.px = peVar4;
    }
    else {
      local_208 = (element_type *)local_2d0._0_8_;
      pbVar6 = (byte *)((long)&(peVar4->m_stream).super_basic_ostream<char,_std::char_traits<char>_>
                               ._vptr_basic_ostream +
                       (long)&(((wrapped_stream *)local_2d0._0_8_)->
                              super_basic_ostream<char,_std::char_traits<char>_>).
                              _vptr_basic_ostream);
      sVar7 = (long)local_2d0.m_message.px - (long)pbVar6;
      uVar17 = uStack_1f4;
      local_218 = pbVar6;
      sStack_210 = sVar7;
      peStack_200 = peVar4;
      local_1f8 = uVar8;
      uStack_1f0 = peVar10;
    }
    aad_01.m_size =
         local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    nonce_00._4_4_ = uVar17;
    nonce_00.first = uVar8;
    nonce_00.second._0_4_ = cVar18;
    nonce_00.second._4_4_ = uVar19;
    plain1.m_size = (size_t)peVar4;
    plain1.m_data = (byte *)local_2d0._0_8_;
    plain2.m_size = sVar7;
    plain2.m_data = pbVar6;
    cipher_01.m_data =
         local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_01.m_data =
         local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    rVar2.super_class_property<bool>.value =
         (class_property<bool>)
         AEADChaCha20Poly1305::Decrypt
                   ((AEADChaCha20Poly1305 *)&local_ac,cipher_01,aad_01,nonce_00,plain1,plain2);
    local_228 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_220 = "";
    local_238 = &boost::unit_test::basic_cstring<char_const>::null;
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x11a;
    file_00.m_begin = (iterator)&local_228;
    msg_00.m_end = keystream_00.m_size;
    msg_00.m_begin = (iterator)aad_01.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_238,
               msg_00);
    local_c8.m_message.px = (element_type *)0x0;
    local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xf6a329;
    local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xf6a32c;
    pbStack_f0 = (pointer)((ulong)pbStack_f0 & 0xffffffffffffff00);
    local_100._8_8_ = &PTR__lazy_ostream_013d3df0;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = &local_290;
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_240 = "";
    keystream_00.m_size = (iterator)0x1;
    pvVar11 = (iterator)0x0;
    local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_c8,(lazy_ostream *)(local_100 + 8),1,0,WARN,CONCAT44(uVar19,cVar18),
               (size_t)&local_248,0x11a);
    boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_250 = "";
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x11b;
    file_01.m_begin = (iterator)&local_258;
    msg_01.m_end = pvVar11;
    msg_01.m_begin = keystream_00.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_268,
               msg_01);
    if ((long)local_2d0.m_message.px - local_2d0._0_8_ ==
        (long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start) {
      local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)((element_type *)local_2d0._0_8_ == local_2d0.m_message.px);
      if (!(bool)local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                 .value) {
        peVar12 = (element_type *)local_2d0._0_8_;
        pbVar6 = local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (*(byte *)&(((wrapped_stream *)local_2d0._0_8_)->
                      super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream ==
            *local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start) {
          do {
            pbVar6 = pbVar6 + 1;
            peVar12 = (element_type *)
                      ((long)&(peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>
                              ._vptr_basic_ostream + 1);
            local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(peVar12 == local_2d0.m_message.px);
            if ((bool)local_c8.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value) goto LAB_0036784f;
          } while (*(byte *)&(peVar12->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream == *pbVar6);
        }
        local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
      }
    }
    else {
      local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
    }
LAB_0036784f:
    local_c8.m_message.px = (element_type *)0x0;
    local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xeaa32d;
    local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0xeaa33e;
    pbStack_f0 = (pointer)((ulong)pbStack_f0 & 0xffffffffffffff00);
    local_100._8_8_ = &PTR__lazy_ostream_013d3df0;
    local_e8 = boost::unit_test::lazy_ostream::inst;
    local_e0 = &local_290;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_270 = "";
    peVar12 = (element_type *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_c8,(lazy_ostream *)(local_100 + 8),1,0,WARN,CONCAT44(uVar19,cVar18),
               (size_t)&local_278,0x11b);
    boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
    if ((element_type *)local_2d0._0_8_ != (element_type *)0x0) {
      operator_delete((void *)local_2d0._0_8_,(long)local_2d0.m_message.pn.pi_ - local_2d0._0_8_);
    }
    ChaCha20::~ChaCha20(&local_ac);
    if ((element_type *)
        local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start != (element_type *)0x0) {
      operator_delete(local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar13 = iVar13 + 1;
    if (iVar13 == 10) {
      std::vector<std::byte,_std::allocator<std::byte>_>::vector
                (&local_290,
                 (long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start,(allocator_type *)&local_ac);
      key_01.m_size =
           (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      key_01.m_data =
           local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      AEADChaCha20Poly1305::AEADChaCha20Poly1305((AEADChaCha20Poly1305 *)&local_ac,key_01);
      keystream_00.m_size =
           (iterator)
           ((long)local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start);
      nonce_02._4_4_ = 0;
      nonce_02.first = uVar8;
      nonce_02.second = (unsigned_long)peVar10;
      keystream_00.m_data =
           local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      AEADChaCha20Poly1305::Keystream((AEADChaCha20Poly1305 *)&local_ac,nonce_02,keystream_00);
      if (local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar15 = 0;
        do {
          local_2a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_298 = "";
          local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_02.m_end = (iterator)0x123;
          file_02.m_begin = (iterator)&local_2a0;
          msg_02.m_end = (iterator)peVar12;
          msg_02.m_begin = keystream_00.m_size;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                     (size_t)&local_2b0,msg_02);
          local_2d0.m_message.px =
               (element_type *)((ulong)local_2d0.m_message.px & 0xffffffffffffff00);
          local_2d0._0_8_ = &PTR__lazy_ostream_013d3cb0;
          local_2d0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_2b8 = "";
          local_2d1 = local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar15] ^
                      local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar15];
          local_128 = local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar15;
          local_c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 (readonly_property<bool>)
                 (local_2d1 ==
                 local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar15]);
          local_c8.m_message.px = (element_type *)0x0;
          local_c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_d8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_d0 = "";
          local_100._0_8_ = &local_2d1;
          pbStack_f0 = (pointer)((ulong)pbStack_f0 & 0xffffffffffffff00);
          local_100._8_8_ = &PTR__lazy_ostream_013d5580;
          local_e8 = boost::unit_test::lazy_ostream::inst;
          local_e0 = (vector<std::byte,_std::allocator<std::byte>_> *)local_100;
          local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish._0_1_ = 0;
          local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013d5580;
          local_120.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
          local_108 = &local_128;
          keystream_00.m_size = (iterator)0x1;
          peVar12 = (element_type *)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_c8,(lazy_ostream *)&local_2d0,1,2,REQUIRE,0xeaa33f,(size_t)&local_d8,
                     0x123,local_100 + 8,"expected_cipher[i]",&local_120);
          boost::detail::shared_count::~shared_count(&local_c8.m_message.pn);
          uVar15 = uVar15 + 1;
        } while (uVar15 < (ulong)((long)local_140.
                                        super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_140.
                                       super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                       _M_impl.super__Vector_impl_data._M_start));
      }
      ChaCha20::~ChaCha20(&local_ac);
      if (local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_290.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((undefined **)
          local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (undefined **)0x0) {
        operator_delete(local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void TestChaCha20Poly1305(const std::string& plain_hex, const std::string& aad_hex, const std::string& key_hex, ChaCha20::Nonce96 nonce, const std::string& cipher_hex)
{
    auto plain = ParseHex<std::byte>(plain_hex);
    auto aad = ParseHex<std::byte>(aad_hex);
    auto key = ParseHex<std::byte>(key_hex);
    auto expected_cipher = ParseHex<std::byte>(cipher_hex);

    for (int i = 0; i < 10; ++i) {
        // During i=0, use single-plain Encrypt/Decrypt; others use a split at prefix.
        size_t prefix = i ? m_rng.randrange(plain.size() + 1) : plain.size();
        // Encrypt.
        std::vector<std::byte> cipher(plain.size() + AEADChaCha20Poly1305::EXPANSION);
        AEADChaCha20Poly1305 aead{key};
        if (i == 0) {
            aead.Encrypt(plain, aad, nonce, cipher);
        } else {
            aead.Encrypt(Span{plain}.first(prefix), Span{plain}.subspan(prefix), aad, nonce, cipher);
        }
        BOOST_CHECK(cipher == expected_cipher);

        // Decrypt.
        std::vector<std::byte> decipher(cipher.size() - AEADChaCha20Poly1305::EXPANSION);
        bool ret{false};
        if (i == 0) {
            ret = aead.Decrypt(cipher, aad, nonce, decipher);
        } else {
            ret = aead.Decrypt(cipher, aad, nonce, Span{decipher}.first(prefix), Span{decipher}.subspan(prefix));
        }
        BOOST_CHECK(ret);
        BOOST_CHECK(decipher == plain);
    }

    // Test Keystream output.
    std::vector<std::byte> keystream(plain.size());
    AEADChaCha20Poly1305 aead{key};
    aead.Keystream(nonce, keystream);
    for (size_t i = 0; i < plain.size(); ++i) {
        BOOST_CHECK_EQUAL(plain[i] ^ keystream[i], expected_cipher[i]);
    }
}